

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dlep_radio_interface.c
# Opt level: O2

void dlep_radio_terminate_all_sessions(void)

{
  list_entity *plVar1;
  avl_tree *paVar2;
  avl_tree *paVar3;
  avl_node *paVar4;
  
  paVar2 = dlep_if_get_tree(true);
  while( true ) {
    paVar2 = (avl_tree *)(paVar2->list_head).next;
    plVar1 = (paVar2->list_head).prev;
    paVar3 = dlep_if_get_tree(true);
    if (plVar1 == (paVar3->list_head).prev) break;
    paVar4 = (avl_node *)&paVar2[1].root;
    while (paVar4 = (avl_node *)(paVar4->list).next,
          (paVar4->list).prev != *(list_entity **)&paVar2[1].count) {
      dlep_session_terminate
                ((dlep_session *)&paVar4[-0x10].list.prev,DLEP_STATUS_OKAY,
                 "DLEP radio is shutting down");
    }
  }
  return;
}

Assistant:

void
dlep_radio_terminate_all_sessions(void) {
  struct dlep_radio_if *interf;
  struct dlep_radio_session *radio_session;

  _shutting_down = true;

  avl_for_each_element(dlep_if_get_tree(true), interf, interf._node) {
    avl_for_each_element(&interf->interf.session_tree, radio_session, _node) {
      dlep_session_terminate(&radio_session->session, DLEP_STATUS_OKAY, "DLEP radio is shutting down");
    }
  }
}